

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void __thiscall google::ErrnoLogMessage::~ErrnoLogMessage(ErrnoLogMessage *this)

{
  ostream *poVar1;
  int err;
  LogStream *pLVar2;
  string local_30;
  
  pLVar2 = &((this->super_LogMessage).data_)->stream_;
  std::__ostream_insert<char,std::char_traits<char>>(&pLVar2->super_ostream,": ",2);
  StrError_abi_cxx11_(&local_30,
                      (google *)(ulong)(uint)((this->super_LogMessage).data_)->preserved_errno_,err)
  ;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (&pLVar2->super_ostream,local_30._M_dataplus._M_p,local_30._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," [",2);
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,((this->super_LogMessage).data_)->preserved_errno_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  LogMessage::~LogMessage(&this->super_LogMessage);
  return;
}

Assistant:

ErrnoLogMessage::~ErrnoLogMessage() {
  // Don't access errno directly because it may have been altered
  // while streaming the message.
  stream() << ": " << StrError(preserved_errno()) << " ["
           << preserved_errno() << "]";
}